

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

string * __thiscall
ktx::DiffEnum<_khr_df_model_channels_e>::value_abi_cxx11_
          (DiffEnum<_khr_df_model_channels_e> *this,size_t index,OutputFormat format)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  _khr_df_model_channels_e *p_Var1;
  char **ppcVar2;
  size_t sVar3;
  int in_ECX;
  v10 *in_RDX;
  char *in_RSI;
  string *in_RDI;
  size_t in_stack_fffffffffffffbf8;
  undefined8 *index_00;
  DiffBase<_khr_df_model_channels_e> *in_stack_fffffffffffffc00;
  char ***pppcVar4;
  string *psVar5;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined8 local_3b8;
  undefined8 local_3b0;
  char **local_3a8;
  undefined8 local_3a0;
  undefined1 local_394 [39];
  allocator<char> local_36d;
  _khr_df_model_channels_e local_36c;
  char **local_368;
  size_t local_360;
  v10 *local_350;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_338 [2];
  undefined8 local_328;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_320;
  char *local_318;
  size_t local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_308;
  char *local_300;
  size_t sStack_2f8;
  char *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_2c8 [3];
  undefined8 local_2b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_2a8;
  char **local_2a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_290;
  char **local_288;
  undefined8 uStack_280;
  char ***local_270;
  char **local_268;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_258;
  undefined8 *local_250;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_248;
  undefined8 local_240;
  undefined8 *local_238;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_230;
  char *local_228;
  char ***local_220;
  char *local_218;
  char ***local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_208 [3];
  undefined8 local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_1e8;
  char *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_1d0;
  char *local_1c8;
  undefined8 uStack_1c0;
  char *local_1b0;
  undefined8 *local_1a8;
  char *local_1a0;
  unsigned_long_long in_stack_fffffffffffffe68;
  undefined8 *puVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffffe70;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar7;
  char *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_b0;
  char **local_a8;
  size_t local_a0;
  uint *local_98;
  v10 *local_90;
  char **local_88;
  size_t sStack_80;
  char *local_70;
  char ***local_68;
  char *local_60;
  char ***local_58;
  char ***local_50;
  char **local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  psVar5 = in_RDI;
  local_350 = in_RDX;
  if (in_ECX == 0) {
    if (*(long *)(in_RSI + (long)in_RDX * 8 + 0x40) == 0) {
      local_2e0 = local_394 + 4;
      local_2e8 = "0x{:x}";
      local_2d8 = "0x{:x}";
      local_394._4_8_ = (long)"{}0x{:x}" + 2;
      local_2d0 = local_2e0;
      local_394._12_8_ = std::char_traits<char>::length((char_type *)0x1d126d);
      p_Var1 = DiffBase<_khr_df_model_channels_e>::rawValue
                         (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      local_394._0_4_ = *p_Var1;
      local_300 = (char *)local_394._4_8_;
      sStack_2f8 = local_394._12_8_;
      local_308 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                   *)local_394;
      aVar7.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_300
      ;
      local_318 = (char *)local_394._4_8_;
      local_310 = local_394._12_8_;
      local_338[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               (local_308,local_350,(uint *)in_RDI);
      local_320 = local_338;
      local_328 = 2;
      fmt_00.size_ = local_394._12_8_;
      fmt_00.data_ = (char *)local_394._4_8_;
      args_00.field_1.values_ = aVar7.values_;
      args_00.desc_ = in_stack_fffffffffffffe68;
      ::fmt::v10::vformat_abi_cxx11_(fmt_00,args_00);
    }
    else if ((in_RSI[0x39] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),in_RSI,
                 (allocator<char> *)in_RDI);
      std::allocator<char>::~allocator(&local_36d);
      psVar5 = in_RDI;
    }
    else {
      local_68 = &local_368;
      local_70 = "0x{:x} ({})";
      local_60 = "0x{:x} ({})";
      local_368 = (char **)0x38728d;
      local_58 = local_68;
      local_360 = std::char_traits<char>::length((char_type *)0x1d0ffa);
      local_8 = local_70;
      p_Var1 = DiffBase<_khr_df_model_channels_e>::rawValue
                         (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      local_36c = *p_Var1;
      local_98 = (uint *)(in_RSI + (long)local_350 * 8 + 0x40);
      local_88 = local_368;
      sStack_80 = local_360;
      local_90 = (v10 *)&local_36c;
      local_50 = &local_88;
      local_a8 = local_368;
      local_a0 = local_360;
      local_48 = local_a8;
      sStack_40 = local_a0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,char_const*const>
                (&local_d8,local_90,local_98,local_368);
      local_30 = &local_b8;
      local_38 = &local_d8;
      local_18 = 0xc2;
      local_b8 = 0xc2;
      fmt.size_ = in_stack_fffffffffffffe80;
      fmt.data_ = in_stack_fffffffffffffe78;
      args.field_1.values_ = in_stack_fffffffffffffe70.values_;
      args.desc_ = in_stack_fffffffffffffe68;
      local_28 = local_38;
      local_20 = local_38;
      local_10 = local_30;
      local_b0 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(fmt,args);
      psVar5 = in_RDI;
    }
  }
  else if (*(long *)(in_RSI + (long)in_RDX * 8 + 0x40) == 0) {
    index_00 = &local_3b8;
    local_1b0 = "{}";
    local_1a0 = "{}";
    local_3b8 = (long)"{} / (from {}) {}" + 0xf;
    local_1a8 = index_00;
    puVar6 = index_00;
    sVar3 = std::char_traits<char>::length((char_type *)0x1d1623);
    index_00[1] = sVar3;
    DiffBase<_khr_df_model_channels_e>::rawValue(in_stack_fffffffffffffc00,(size_t)index_00);
    local_1c8 = (char *)local_3b8;
    uStack_1c0 = local_3b0;
    local_1d0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *)
                &stack0xfffffffffffffc44;
    local_1e0 = (char *)local_3b8;
    local_208[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                             (local_1d0,local_350,(int *)in_RDI);
    local_1e8 = local_208;
    local_1f0 = 1;
    fmt_02.size_ = in_stack_fffffffffffffe80;
    fmt_02.data_ = in_stack_fffffffffffffe78;
    args_02.field_1.values_ = in_stack_fffffffffffffe70.values_;
    args_02.desc_ = (unsigned_long_long)puVar6;
    ::fmt::v10::vformat_abi_cxx11_(fmt_02,args_02);
  }
  else {
    pppcVar4 = &local_3a8;
    local_228 = "\"{}\"";
    local_218 = "\"{}\"";
    local_3a8 = (char **)0x391283;
    local_220 = pppcVar4;
    local_210 = pppcVar4;
    ppcVar2 = (char **)std::char_traits<char>::length((char_type *)0x1d145c);
    pppcVar4[1] = ppcVar2;
    local_290 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                 *)(in_RSI + (long)local_350 * 8 + 0x40);
    local_288 = local_3a8;
    uStack_280 = local_3a0;
    local_270 = &local_288;
    local_2a0 = local_3a8;
    local_268 = local_2a0;
    local_2c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*const>
                             (local_290,(v10 *)in_RDI,local_3a8);
    local_250 = &local_2b0;
    local_258 = local_2c8;
    local_240 = 0xc;
    local_2b0 = 0xc;
    fmt_01.size_ = in_stack_fffffffffffffe80;
    fmt_01.data_ = in_stack_fffffffffffffe78;
    args_01.field_1.values_ = in_stack_fffffffffffffe70.values_;
    args_01.desc_ = in_stack_fffffffffffffe68;
    local_248 = local_258;
    local_238 = local_250;
    local_230 = local_258;
    local_2a8 = local_258;
    ::fmt::v10::vformat_abi_cxx11_(fmt_01,args_01);
  }
  return psVar5;
}

Assistant:

virtual std::string value(std::size_t index, OutputFormat format) const override {
        if (format == OutputFormat::text) {
            if (enumNames[index]) {
                if (hexInText) {
                    return fmt::format("0x{:x} ({})", uint32_t(DiffBase<T>::rawValue(index)), enumNames[index]);
                } else {
                    return enumNames[index];
                }
            } else {
                return fmt::format("0x{:x}", uint32_t(DiffBase<T>::rawValue(index)));
            }
        } else {
            if (enumNames[index]) {
                return fmt::format("\"{}\"", enumNames[index]);
            } else {
                return fmt::format("{}", int32_t(DiffBase<T>::rawValue(index)));
            }
        }
    }